

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject * luaC_newobj(lua_State *L,int tt,size_t sz,GCObject **list,int offset)

{
  global_State *pgVar1;
  void *pvVar2;
  GCObject *pGVar3;
  GCObject *o;
  char *raw;
  global_State *g;
  GCObject **ppGStack_28;
  int offset_local;
  GCObject **list_local;
  size_t sz_local;
  int tt_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  pvVar2 = luaM_realloc_(L,(void *)0x0,(long)(int)(tt & 0xf),sz);
  pGVar3 = (GCObject *)((long)pvVar2 + (long)offset);
  ppGStack_28 = list;
  if (list == (GCObject **)0x0) {
    ppGStack_28 = &pgVar1->allgc;
  }
  (pGVar3->gch).marked = pgVar1->currentwhite & 3;
  (pGVar3->gch).tt = (lu_byte)tt;
  (pGVar3->gch).next = *ppGStack_28;
  *ppGStack_28 = pGVar3;
  return pGVar3;
}

Assistant:

GCObject *luaC_newobj (lua_State *L, int tt, size_t sz, GCObject **list,
                       int offset) {
  global_State *g = G(L);
  char *raw = cast(char *, luaM_newobject(L, novariant(tt), sz));
  GCObject *o = obj2gco(raw + offset);
  if (list == NULL)
    list = &g->allgc;  /* standard list for collectable objects */
  gch(o)->marked = luaC_white(g);
  gch(o)->tt = tt;
  gch(o)->next = *list;
  *list = o;
  return o;
}